

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O1

dev_t archive_entry_rdev(archive_entry *entry)

{
  ulonglong uVar1;
  
  if ((entry->ae_set & L'\x2000') == L'\0') {
    return 0;
  }
  if ((entry->ae_stat).aest_rdev_is_broken_down != L'\0') {
    uVar1 = gnu_dev_makedev((uint)(entry->ae_stat).aest_rdevmajor,
                            (uint)(entry->ae_stat).aest_rdevminor);
    return uVar1;
  }
  return (entry->ae_stat).aest_rdev;
}

Assistant:

__LA_DEV_T
archive_entry_rdev(struct archive_entry *entry)
{
	if (archive_entry_rdev_is_set(entry)) {
		if (entry->ae_stat.aest_rdev_is_broken_down)
			return ae_makedev(entry->ae_stat.aest_rdevmajor,
			    entry->ae_stat.aest_rdevminor);
		else
			return (entry->ae_stat.aest_rdev);
	} else {
		return 0;
	}
}